

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall
c4::yml::
Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::_write_json(Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *this,NodeScalar *sc,NodeType flags)

{
  pfn_error p_Var1;
  Location LVar2;
  Location LVar3;
  bool bVar4;
  error_flags eVar5;
  Callbacks *pCVar6;
  ulong in_RDX;
  long *in_RSI;
  long in_RDI;
  bool in_stack_00000096;
  bool in_stack_00000097;
  Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000098;
  csubstr in_stack_000000a0;
  char msg_1 [27];
  char msg [24];
  size_t in_stack_fffffffffffffeb0;
  size_t in_stack_fffffffffffffeb8;
  size_t in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  bool local_e1;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  size_t local_b0;
  char local_a8 [40];
  undefined8 local_80;
  size_t sStack_78;
  size_t local_70;
  size_t sStack_68;
  char *local_60;
  char local_58 [48];
  ulong local_28;
  ulong *local_20;
  ulong *local_10;
  ulong *local_8;
  
  local_e1 = true;
  if (in_RSI[1] != 0) {
    local_e1 = *in_RSI == 0;
  }
  local_28 = in_RDX;
  if (!local_e1) {
    builtin_strncpy(local_58,"JSON does not have tags",0x18);
    eVar5 = get_error_flags();
    if (((eVar5 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
      trap_instruction();
    }
    pCVar6 = Tree::callbacks(*(Tree **)(in_RDI + 0x10));
    p_Var1 = pCVar6->m_error;
    Location::Location((Location *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                       in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8
                       ,in_stack_fffffffffffffeb0);
    pCVar6 = Tree::callbacks(*(Tree **)(in_RDI + 0x10));
    LVar2.super_LineCol.line = sStack_78;
    LVar2.super_LineCol.offset = local_80;
    LVar2.super_LineCol.col = local_70;
    LVar2.name.str = (char *)sStack_68;
    LVar2.name.len = (size_t)local_60;
    (*p_Var1)(local_58,0x18,LVar2,pCVar6->m_user_data);
    in_stack_fffffffffffffeb0 = sStack_78;
    in_stack_fffffffffffffeb8 = local_70;
    in_stack_fffffffffffffec0 = sStack_68;
    in_stack_fffffffffffffec8 = local_60;
  }
  local_10 = &local_28;
  if ((local_28 & 0x300) != 0) {
    builtin_strncpy(local_a8,"JSON does not have anchors",0x1b);
    eVar5 = get_error_flags();
    if (((eVar5 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
      trap_instruction();
    }
    pCVar6 = Tree::callbacks(*(Tree **)(in_RDI + 0x10));
    p_Var1 = pCVar6->m_error;
    Location::Location((Location *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                       in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8
                       ,in_stack_fffffffffffffeb0);
    pCVar6 = Tree::callbacks(*(Tree **)(in_RDI + 0x10));
    LVar3.super_LineCol.line = uStack_c8;
    LVar3.super_LineCol.offset = local_d0;
    LVar3.super_LineCol.col = local_c0;
    LVar3.name.str = (char *)uStack_b8;
    LVar3.name.len = local_b0;
    (*p_Var1)(local_a8,0x1b,LVar3,pCVar6->m_user_data);
  }
  local_20 = &local_28;
  local_8 = &local_28;
  _write_scalar_json(in_stack_00000098,in_stack_000000a0,in_stack_00000097,in_stack_00000096);
  return;
}

Assistant:

void Emitter<Writer>::_write_json(NodeScalar const& C4_RESTRICT sc, NodeType flags)
{
    if(C4_UNLIKELY( ! sc.tag.empty()))
        _RYML_CB_ERR(m_tree->callbacks(), "JSON does not have tags");
    if(C4_UNLIKELY(flags.has_anchor()))
        _RYML_CB_ERR(m_tree->callbacks(), "JSON does not have anchors");
    _write_scalar_json(sc.scalar, flags.has_key(), flags.is_quoted());
}